

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.h
# Opt level: O0

uint getWRegFromXReg(uint Reg)

{
  uint local_c;
  uint Reg_local;
  
  switch(Reg) {
  case 1:
    local_c = 0xc5;
    break;
  case 2:
    local_c = 0xc6;
    break;
  default:
    local_c = Reg;
    break;
  case 4:
    local_c = 5;
    break;
  case 7:
    local_c = 6;
    break;
  case 199:
    local_c = 0xa8;
    break;
  case 200:
    local_c = 0xa9;
    break;
  case 0xc9:
    local_c = 0xaa;
    break;
  case 0xca:
    local_c = 0xab;
    break;
  case 0xcb:
    local_c = 0xac;
    break;
  case 0xcc:
    local_c = 0xad;
    break;
  case 0xcd:
    local_c = 0xae;
    break;
  case 0xce:
    local_c = 0xaf;
    break;
  case 0xcf:
    local_c = 0xb0;
    break;
  case 0xd0:
    local_c = 0xb1;
    break;
  case 0xd1:
    local_c = 0xb2;
    break;
  case 0xd2:
    local_c = 0xb3;
    break;
  case 0xd3:
    local_c = 0xb4;
    break;
  case 0xd4:
    local_c = 0xb5;
    break;
  case 0xd5:
    local_c = 0xb6;
    break;
  case 0xd6:
    local_c = 0xb7;
    break;
  case 0xd7:
    local_c = 0xb8;
    break;
  case 0xd8:
    local_c = 0xb9;
    break;
  case 0xd9:
    local_c = 0xba;
    break;
  case 0xda:
    local_c = 0xbb;
    break;
  case 0xdb:
    local_c = 0xbc;
    break;
  case 0xdc:
    local_c = 0xbd;
    break;
  case 0xdd:
    local_c = 0xbe;
    break;
  case 0xde:
    local_c = 0xbf;
    break;
  case 0xdf:
    local_c = 0xc0;
    break;
  case 0xe0:
    local_c = 0xc1;
    break;
  case 0xe1:
    local_c = 0xc2;
    break;
  case 0xe2:
    local_c = 0xc3;
    break;
  case 0xe3:
    local_c = 0xc4;
  }
  return local_c;
}

Assistant:

inline static unsigned getWRegFromXReg(unsigned Reg)
{
	switch (Reg) {
		case ARM64_REG_X0: return ARM64_REG_W0;
		case ARM64_REG_X1: return ARM64_REG_W1;
		case ARM64_REG_X2: return ARM64_REG_W2;
		case ARM64_REG_X3: return ARM64_REG_W3;
		case ARM64_REG_X4: return ARM64_REG_W4;
		case ARM64_REG_X5: return ARM64_REG_W5;
		case ARM64_REG_X6: return ARM64_REG_W6;
		case ARM64_REG_X7: return ARM64_REG_W7;
		case ARM64_REG_X8: return ARM64_REG_W8;
		case ARM64_REG_X9: return ARM64_REG_W9;
		case ARM64_REG_X10: return ARM64_REG_W10;
		case ARM64_REG_X11: return ARM64_REG_W11;
		case ARM64_REG_X12: return ARM64_REG_W12;
		case ARM64_REG_X13: return ARM64_REG_W13;
		case ARM64_REG_X14: return ARM64_REG_W14;
		case ARM64_REG_X15: return ARM64_REG_W15;
		case ARM64_REG_X16: return ARM64_REG_W16;
		case ARM64_REG_X17: return ARM64_REG_W17;
		case ARM64_REG_X18: return ARM64_REG_W18;
		case ARM64_REG_X19: return ARM64_REG_W19;
		case ARM64_REG_X20: return ARM64_REG_W20;
		case ARM64_REG_X21: return ARM64_REG_W21;
		case ARM64_REG_X22: return ARM64_REG_W22;
		case ARM64_REG_X23: return ARM64_REG_W23;
		case ARM64_REG_X24: return ARM64_REG_W24;
		case ARM64_REG_X25: return ARM64_REG_W25;
		case ARM64_REG_X26: return ARM64_REG_W26;
		case ARM64_REG_X27: return ARM64_REG_W27;
		case ARM64_REG_X28: return ARM64_REG_W28;
		case ARM64_REG_FP: return ARM64_REG_W29;
		case ARM64_REG_LR: return ARM64_REG_W30;
		case ARM64_REG_SP: return ARM64_REG_WSP;
		case ARM64_REG_XZR: return ARM64_REG_WZR;
	}

	// For anything else, return it unchanged.
	return Reg;
}